

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O1

String * axl::io::getFileName(String *__return_storage_ptr__,StringRef *filePath)

{
  char *pcVar1;
  size_t sVar2;
  StringRef SStack_28;
  
  sVar2 = filePath->m_length;
  if (sVar2 == 0) {
LAB_00137557:
    sVar2 = 0xffffffffffffffff;
  }
  else {
    do {
      pcVar1 = filePath->m_p + (sVar2 - 1);
      if (pcVar1 < filePath->m_p) goto LAB_00137557;
      sVar2 = sVar2 - 1;
    } while (*pcVar1 != '/');
  }
  if (sVar2 == 0xffffffffffffffff) {
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(&SStack_28,filePath);
  }
  else {
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getSubString
              (&SStack_28,filePath,sVar2 + 1,0xffffffffffffffff);
  }
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            (__return_storage_ptr__,&SStack_28);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&SStack_28);
  return __return_storage_ptr__;
}

Assistant:

sl::String
getFileName(const sl::StringRef& filePath) {
#if (_AXL_OS_WIN)
	char buffer[256];
	sl::String_w filePath_w(rc::BufKind_Stack, buffer, sizeof(buffer));
	filePath_w = filePath;

	wchar_t fileName[1024] = { 0 };
	wchar_t extension[1024] = { 0 };

	_wsplitpath_s(
		filePath_w,
		NULL, 0,
		NULL, 0,
		fileName, countof(fileName) - 1,
		extension, countof(extension) - 1
	);

	sl::String string = fileName;
	string.append(extension);
	return string;
#elif (_AXL_OS_POSIX)
	size_t i = filePath.reverseFind('/');
	return i != -1 ? filePath.getSubString(i + 1) : filePath;
#endif
}